

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InertialParametersSolidShapesHelpers.cpp
# Opt level: O0

bool iDynTree::computeBoundingBoxFromShape(SolidShape *geom,Box *box)

{
  ulong uVar1;
  Transform *in_RSI;
  double dVar2;
  Cylinder *pCylinder;
  Sphere *pSphere;
  Box *pBox;
  Box *in_stack_ffffffffffffff88;
  Box *in_stack_ffffffffffffff90;
  bool local_1;
  
  uVar1 = iDynTree::SolidShape::isBox();
  if ((uVar1 & 1) == 0) {
    uVar1 = iDynTree::SolidShape::isSphere();
    if ((uVar1 & 1) == 0) {
      uVar1 = iDynTree::SolidShape::isCylinder();
      if ((uVar1 & 1) == 0) {
        iDynTree::reportError
                  ("","computeBoundingBoxFromShape",
                   "IDYNTREE_USES_ASSIMP CMake option need to be set to ON to use computeBoundingBoxFromShape"
                  );
        local_1 = false;
      }
      else {
        iDynTree::SolidShape::asCylinder();
        dVar2 = (double)iDynTree::Cylinder::getRadius();
        iDynTree::Box::setX(dVar2 * 2.0);
        dVar2 = (double)iDynTree::Cylinder::getRadius();
        iDynTree::Box::setY(dVar2 * 2.0);
        dVar2 = (double)iDynTree::Cylinder::getLength();
        iDynTree::Box::setZ(dVar2);
        iDynTree::SolidShape::getLink_H_geometry();
        iDynTree::SolidShape::setLink_H_geometry(in_RSI);
        local_1 = true;
      }
    }
    else {
      iDynTree::SolidShape::asSphere();
      dVar2 = (double)iDynTree::Sphere::getRadius();
      iDynTree::Box::setX(dVar2 * 2.0);
      dVar2 = (double)iDynTree::Sphere::getRadius();
      iDynTree::Box::setY(dVar2 * 2.0);
      dVar2 = (double)iDynTree::Sphere::getRadius();
      iDynTree::Box::setZ(dVar2 * 2.0);
      iDynTree::SolidShape::getLink_H_geometry();
      iDynTree::SolidShape::setLink_H_geometry(in_RSI);
      local_1 = true;
    }
  }
  else {
    iDynTree::SolidShape::asBox();
    Box::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    iDynTree::SolidShape::getLink_H_geometry();
    iDynTree::SolidShape::setLink_H_geometry(in_RSI);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool computeBoundingBoxFromShape(const SolidShape& geom, Box& box)
{
    // Extract BB from shape, this would be benefic from being moved as a method in the SolidShape interface
    if (geom.isBox())
    {
        // If shape is a box, just copy it
        Box* pBox = const_cast<Box*>(geom.asBox());
        box = *pBox;
        box.setLink_H_geometry(geom.getLink_H_geometry());
        return true;
    }

    if (geom.isSphere())
    {
        // If shape is a sphere all the side of the BB are the diameter of the sphere
        Sphere* pSphere = const_cast<Sphere *>(geom.asSphere());
        box.setX(2.0*pSphere->getRadius());
        box.setY(2.0*pSphere->getRadius());
        box.setZ(2.0*pSphere->getRadius());
        box.setLink_H_geometry(geom.getLink_H_geometry());
        return true;
    }

    if (geom.isCylinder())
    {
        // If shape is a cylinder the x and y side of the BB are the diameter of the cylinder,
        // while the z side is the lenght of the cylinder
        Cylinder* pCylinder = const_cast<Cylinder *>(geom.asCylinder());
        box.setX(2.0*pCylinder->getRadius());
        box.setY(2.0*pCylinder->getRadius());
        box.setZ(pCylinder->getLength());
        box.setLink_H_geometry(geom.getLink_H_geometry());
        return true;
    }
    
#ifdef IDYNTREE_USES_ASSIMP
    if (geom.isExternalMesh())
    {
        // If shape is an external mesh, we need to load the mesh and extract the BB
        ExternalMesh* pExtMesh = const_cast<ExternalMesh *>(geom.asExternalMesh());
        return BBFromExternalShape(pExtMesh, box);
    }    
#else
    reportError("", "computeBoundingBoxFromShape", "IDYNTREE_USES_ASSIMP CMake option need to be set to ON to use computeBoundingBoxFromShape");
#endif
    return false;
    
}